

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

bool __thiscall
Rml::DataInterpreter::ExtractArgumentsFromStack
          (DataInterpreter *this,Vector<Variant> *out_arguments)

{
  move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>_>
  __last;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>_>
  __first;
  allocator<char> local_41;
  String local_40;
  
  uVar2 = Variant::Get<int>(&this->R,-1);
  if ((int)uVar2 < 0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Invalid number of arguments.",&local_41);
    bVar1 = Error(this,&local_40);
  }
  else {
    __last._M_current._M_current =
         (__normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
          )(this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
           super__Vector_impl_data._M_finish;
    uVar3 = ((long)__last._M_current._M_current -
            (long)(this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x28;
    if (uVar2 <= uVar3) {
      __first._M_current._M_current =
           (__normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
            )((ulong)uVar2 * -0x28 + (long)__last._M_current._M_current);
      ::std::vector<Rml::Variant,std::allocator<Rml::Variant>>::
      insert<std::move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>>,void>
                ((vector<Rml::Variant,std::allocator<Rml::Variant>> *)out_arguments,
                 (out_arguments->super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>).
                 _M_impl.super__Vector_impl_data._M_finish,__first,__last);
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::erase
                (&this->stack,(const_iterator)__first._M_current._M_current,
                 (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      return true;
    }
    CreateString_abi_cxx11_
              (&local_40,"Cannot pop %d arguments, stack contains only %zu elements.",(ulong)uVar2,
               uVar3);
    bVar1 = Error(this,&local_40);
  }
  ::std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool ExtractArgumentsFromStack(Vector<Variant>& out_arguments)
	{
		int num_arguments = R.Get<int>(-1);
		if (num_arguments < 0)
			return Error("Invalid number of arguments.");
		if (stack.size() < size_t(num_arguments))
			return Error(CreateString("Cannot pop %d arguments, stack contains only %zu elements.", num_arguments, stack.size()));

		const auto it_stack_begin_arguments = stack.end() - num_arguments;
		out_arguments.insert(out_arguments.end(), std::make_move_iterator(it_stack_begin_arguments), std::make_move_iterator(stack.end()));

		stack.erase(it_stack_begin_arguments, stack.end());
		return true;
	}